

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall dtc::fdt::property::write_dts(property *this,FILE *file,int indent)

{
  value_type *__x;
  value_type *pvVar1;
  property_value *other;
  property_value *ppVar2;
  pointer ppVar3;
  bool bVar4;
  pointer this_00;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *pvVar5;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> v;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> local_48;
  
  if (0 < indent) {
    do {
      putc(9,(FILE *)file);
      indent = indent + -1;
    } while (indent != 0);
  }
  if ((this->key)._M_string_length != 0) {
    fputs((this->key)._M_dataplus._M_p,(FILE *)file);
  }
  __x = (this->values).
        super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->values).
           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    local_48.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((ulong)(((long)pvVar1 - (long)__x >> 5) * -0x5555555555555555) < 2) {
      pvVar5 = &this->values;
    }
    else {
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&local_48,__x);
      other = (this->values).
              super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
              ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->values).
               super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        other = other + 1;
        pvVar5 = &local_48;
        if (other == ppVar2) break;
        bVar4 = property_value::try_to_merge
                          (local_48.
                           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,other);
        if (!bVar4) {
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(&local_48,other);
        }
      }
    }
    fputs(" = ",(FILE *)file);
    this_00 = (pvVar5->
              super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (pvVar5->
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != ppVar3) {
      while( true ) {
        property_value::write_dts(this_00,file);
        this_00 = this_00 + 1;
        if (this_00 == ppVar3) break;
        putc(0x2c,(FILE *)file);
        putc(0x20,(FILE *)file);
      }
    }
    std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::~vector
              (&local_48);
  }
  fputs(";\n",(FILE *)file);
  return;
}

Assistant:

void
property::write_dts(FILE *file, int indent)
{
	for (int i=0 ; i<indent ; i++)
	{
		putc('\t', file);
	}
#ifdef PRINT_LABELS
	for (auto &l : labels)
	{
		fputs(l.c_str(), file);
		fputs(": ", file);
	}
#endif
	if (key != string())
	{
		fputs(key.c_str(), file);
	}
	if (!values.empty())
	{
		std::vector<property_value> *vals = &values;
		std::vector<property_value> v;
		// If we've got multiple values then try to merge them all together.
		if (values.size() > 1)
		{
			vals = &v;
			v.push_back(values.front());
			for (auto i=(++begin()), e=end() ; i!=e ; ++i)
			{
				if (!v.back().try_to_merge(*i))
				{
					v.push_back(*i);
				}
			}
		}
		fputs(" = ", file);
		for (auto i=vals->begin(), e=vals->end() ; i!=e ; ++i)
		{
			i->write_dts(file);
			if (i+1 != e)
			{
				putc(',', file);
				putc(' ', file);
			}
		}
	}
	fputs(";\n", file);
}